

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

void anon_unknown.dwarf_11e01b::testReadWriteManifest(string *tempDir)

{
  ChannelGroupManifest *pCVar1;
  reference pvVar2;
  string *psVar3;
  undefined1 uVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  ChannelGroupManifest *idGroup2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chans2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  ChannelGroupManifest *idGroup;
  IDManifest mfst;
  string fn;
  string *in_stack_fffffffffffffbc8;
  ChannelGroupManifest *in_stack_fffffffffffffbd0;
  allocator_type *in_stack_fffffffffffffbe0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  value_type *in_stack_fffffffffffffbe8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  allocator<char> *in_stack_fffffffffffffc00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc08;
  string *__s;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  allocator<char> local_321;
  string local_320 [39];
  undefined1 local_2f9 [40];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [32];
  string *local_288;
  _Base_ptr local_280;
  undefined1 local_278;
  allocator<char> local_269;
  string local_268 [32];
  _Base_ptr local_248;
  undefined1 local_240;
  allocator<char> local_231;
  string local_230 [87];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [31];
  undefined1 in_stack_ffffffffffffff37;
  string *in_stack_ffffffffffffff38;
  IDManifest *in_stack_ffffffffffffff40;
  IdLifetime local_a0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  allocator<char> local_79;
  string local_78 [32];
  ChannelGroupManifest *local_58;
  IDManifest local_40;
  string local_28 [40];
  
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  Imf_3_4::IDManifest::IDManifest(&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pCVar1 = (ChannelGroupManifest *)Imf_3_4::IDManifest::add((string *)&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  local_58 = pCVar1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1a144b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8,
           in_stack_fffffffffffffbe0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1a1474);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_98,0);
  std::__cxx11::string::operator=((string *)pvVar2,"model");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_98,1);
  std::__cxx11::string::operator=((string *)pvVar2,"material");
  Imf_3_4::IDManifest::ChannelGroupManifest::setComponents((vector *)local_58);
  Imf_3_4::IDManifest::ChannelGroupManifest::setHashScheme
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  local_a0[0] = LIFETIME_STABLE;
  Imf_3_4::IDManifest::ChannelGroupManifest::setLifetime(local_58,local_a0);
  pCVar1 = (ChannelGroupManifest *)Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_58,1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pCVar1 = (ChannelGroupManifest *)
           Imf_3_4::IDManifest::ChannelGroupManifest::operator<<
                     (pCVar1,(string *)&stack0xffffffffffffff40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  pCVar1 = (ChannelGroupManifest *)Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_58,2)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pCVar1 = (ChannelGroupManifest *)
           Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  pCVar1 = (ChannelGroupManifest *)Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_58,3)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pCVar1 = (ChannelGroupManifest *)
           Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  pCVar1 = (ChannelGroupManifest *)Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(local_58,4)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pCVar1 = (ChannelGroupManifest *)
           Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(pCVar1,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1a18bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  local_248 = (_Base_ptr)pVar5.first._M_node;
  local_240 = pVar5.second;
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
             ,in_stack_fffffffffffffc00);
  pVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  local_280 = (_Base_ptr)pVar5.first._M_node;
  uVar4 = pVar5.second;
  local_278 = uVar4;
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  psVar3 = (string *)Imf_3_4::IDManifest::add((set *)&local_40);
  __a = &local_2a9;
  __s = psVar3;
  local_288 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar4,in_stack_fffffffffffffc10),(char *)__s,__a);
  Imf_3_4::IDManifest::ChannelGroupManifest::setComponent(psVar3);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  Imf_3_4::IDManifest::ChannelGroupManifest::setHashScheme
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  Imf_3_4::IDManifest::ChannelGroupManifest::setEncodingScheme
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  psVar3 = local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar4,in_stack_fffffffffffffc10),(char *)__s,__a);
  Imf_3_4::IDManifest::ChannelGroupManifest::insert(psVar3);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  psVar3 = local_288;
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_2f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar4,in_stack_fffffffffffffc10),(char *)__s,__a);
  Imf_3_4::IDManifest::ChannelGroupManifest::insert(psVar3);
  std::__cxx11::string::~string((string *)(local_2f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2f9);
  psVar3 = local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar4,in_stack_fffffffffffffc10),(char *)__s,__a);
  Imf_3_4::IDManifest::ChannelGroupManifest::insert(psVar3);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  doReadWriteManifest(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      (bool)in_stack_ffffffffffffff37);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1a1bd9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  Imf_3_4::IDManifest::~IDManifest((IDManifest *)0x1a1bf3);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void
testReadWriteManifest (const string& tempDir)
{
    const string fn = tempDir + "id_manifest.exr";

    //
    // create a manifest with two separate channel groups
    //
    // the first is for a channel called "id", which encodes two components in the same
    // channel, called model and material
    //
    IDManifest                        mfst;
    IDManifest::ChannelGroupManifest& idGroup = mfst.add ("id");
    vector<string>                    comps (2);
    comps[0] = "model";
    comps[1] = "material";
    idGroup.setComponents (comps);
    idGroup.setHashScheme (IDManifest::NOTHASHED);
    idGroup.setLifetime (IDManifest::LIFETIME_STABLE);

    // use insertion operator to set ID number, then the string for each
    idGroup << 1 << "merino/body"
            << "wool";
    idGroup << 2 << "merino/body"
            << "skin";
    idGroup << 3 << "merino/body"
            << "skin";
    idGroup << 4 << "merino/eye"
            << "eye";

    //
    // the second channel group would be a 64 bit ID spread across two 32 bit channels
    // called instance1 and instance2.
    //
    set<string> chans2;
    chans2.insert ("instance1");
    chans2.insert ("instance2");
    IDManifest::ChannelGroupManifest& idGroup2 = mfst.add (chans2);
    idGroup2.setComponent ("instance");
    idGroup2.setHashScheme (IDManifest::MURMURHASH3_64);
    idGroup2.setEncodingScheme (IDManifest::ID2_SCHEME);

    //
    // insert strings into attribute, and allow the library to compute the IDs for us
    // (in practice, the return value from insert would be used as the value written
    // into the image data)
    //
    idGroup2.insert ("1/2/3/4/5");
    idGroup2.insert ("6/7/8/9/10");
    idGroup2.insert ("11/12/13/14/15");

    //
    // read/write and test the manifest. Although the manifest implies there are
    // three channels (id,instance1 and instance2) those don't actually get written into the file
    // in this test
    //
    doReadWriteManifest (mfst, fn, true);
}